

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

void __thiscall
CodeGenGenericContext::OverwriteRegisterWithUnknown(CodeGenGenericContext *this,x86XmmReg reg)

{
  KillRegister(this,reg);
  InvalidateDependand(this,reg);
  this->xmmReg[reg].type = argNone;
  this->xmmRegUpdate[reg] = (uint)(((long)this->x86Op - (long)this->x86Base) / 0x50);
  this->xmmRegRead[reg] = false;
  return;
}

Assistant:

void CodeGenGenericContext::OverwriteRegisterWithUnknown(x86XmmReg reg)
{
	// Destination is updated
	KillRegister(reg);
	InvalidateDependand(reg);

	xmmReg[reg].type = x86Argument::argNone;
	xmmRegUpdate[reg] = unsigned(x86Op - x86Base);
	xmmRegRead[reg] = false;
}